

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_recv_disc(udp_ep *ep,udp_sp_disc *disc,nng_sockaddr *sa)

{
  udp_pipe *puVar1;
  nni_aio *aio_00;
  nni_aio *aio;
  udp_pipe *p;
  nng_sockaddr *sa_local;
  udp_sp_disc *disc_local;
  udp_ep *ep_local;
  
  puVar1 = udp_find_pipe(ep,disc->us_peer_id,disc->us_sender_id);
  if (puVar1 != (udp_pipe *)0x0) {
    puVar1->closed = true;
    while (aio_00 = (nni_aio *)nni_list_first(&puVar1->rx_aios), aio_00 != (nni_aio *)0x0) {
      nni_aio_list_remove(aio_00);
      nni_aio_finish_error(aio_00,NNG_ECLOSED);
    }
  }
  return;
}

Assistant:

static void
udp_recv_disc(udp_ep *ep, udp_sp_disc *disc, nng_sockaddr *sa)
{
	udp_pipe *p;
	nni_aio  *aio;
	NNI_ARG_UNUSED(sa);

	p = udp_find_pipe(ep, disc->us_peer_id, disc->us_sender_id);
	if (p != NULL) {
		// For now we aren't validating the sequence numbers.
		// This allows for an out of order DISC to cause the
		// connection to be dropped, but it should self heal.
		p->closed = true;
		while ((aio = nni_list_first(&p->rx_aios)) != NULL) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
	}
}